

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_sx_sy_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar17 [16];
  short sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  
  auVar15 = _DAT_00468ca0;
  auVar14 = _DAT_00468c70;
  auVar13 = _DAT_00424100;
  do {
    uVar1 = *(undefined8 *)mask;
    uVar2 = *(undefined8 *)(mask + mask_stride);
    auVar28[0] = (char)uVar2 + (char)uVar1;
    auVar28[1] = (char)((ulong)uVar2 >> 8) + (char)((ulong)uVar1 >> 8);
    auVar28[2] = (char)((ulong)uVar2 >> 0x10) + (char)((ulong)uVar1 >> 0x10);
    auVar28[3] = (char)((ulong)uVar2 >> 0x18) + (char)((ulong)uVar1 >> 0x18);
    auVar28[4] = (char)((ulong)uVar2 >> 0x20) + (char)((ulong)uVar1 >> 0x20);
    auVar28[5] = (char)((ulong)uVar2 >> 0x28) + (char)((ulong)uVar1 >> 0x28);
    auVar28[6] = (char)((ulong)uVar2 >> 0x30) + (char)((ulong)uVar1 >> 0x30);
    auVar28[7] = (char)((ulong)uVar2 >> 0x38) + (char)((ulong)uVar1 >> 0x38);
    auVar28._8_8_ = 0;
    auVar25 = pshufb(auVar28,auVar14);
    auVar17._0_8_ = auVar25._8_8_;
    auVar17._8_4_ = auVar25._8_4_;
    auVar17._12_4_ = auVar25._12_4_;
    auVar28 = auVar25 & auVar17;
    auVar25 = auVar25 ^ auVar17;
    auVar26._0_2_ = auVar25._0_2_ >> 1;
    auVar26._2_2_ = auVar25._2_2_ >> 1;
    auVar26._4_2_ = auVar25._4_2_ >> 1;
    auVar26._6_2_ = auVar25._6_2_ >> 1;
    auVar26._8_2_ = auVar25._8_2_ >> 1;
    auVar26._10_2_ = auVar25._10_2_ >> 1;
    auVar26._12_2_ = auVar25._12_2_ >> 1;
    auVar26._14_2_ = auVar25._14_2_ >> 1;
    auVar26 = auVar26 & auVar13;
    auVar27[0] = auVar26[0] + auVar28[0];
    auVar27[1] = auVar26[1] + auVar28[1];
    auVar27[2] = auVar26[2] + auVar28[2];
    auVar27[3] = auVar26[3] + auVar28[3];
    auVar27[4] = auVar26[4] + auVar28[4];
    auVar27[5] = auVar26[5] + auVar28[5];
    auVar27[6] = auVar26[6] + auVar28[6];
    auVar27[7] = auVar26[7] + auVar28[7];
    auVar27[8] = auVar26[8] + auVar28[8];
    auVar27[9] = auVar26[9] + auVar28[9];
    auVar27[10] = auVar26[10] + auVar28[10];
    auVar27[0xb] = auVar26[0xb] + auVar28[0xb];
    auVar27[0xc] = auVar26[0xc] + auVar28[0xc];
    auVar27[0xd] = auVar26[0xd] + auVar28[0xd];
    auVar27[0xe] = auVar26[0xe] + auVar28[0xe];
    auVar27[0xf] = auVar26[0xf] + auVar28[0xf];
    auVar17 = pmovzxbw(auVar17,auVar27);
    sVar16 = pavgw(auVar17._0_2_,0);
    sVar18 = pavgw(auVar17._2_2_,0);
    sVar19 = pavgw(auVar17._4_2_,0);
    sVar20 = pavgw(auVar17._6_2_,0);
    sVar21 = pavgw(auVar17._8_2_,0);
    sVar22 = pavgw(auVar17._10_2_,0);
    sVar23 = pavgw(auVar17._12_2_,0);
    sVar24 = pavgw(auVar17._14_2_,0);
    cVar5 = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    cVar6 = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    cVar7 = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    cVar8 = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    cVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    cVar10 = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    cVar11 = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    cVar12 = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    uVar3 = *(undefined4 *)src0;
    uVar4 = *(undefined4 *)src1;
    auVar29._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar4 >> 0x18),(char)((uint)uVar3 >> 0x18)),
                                 (char)((uint)uVar4 >> 0x10)),
                        CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >> 0x20);
    auVar29[3] = (char)((uint)uVar4 >> 8);
    auVar29[2] = (char)((uint)uVar3 >> 8);
    auVar29[0] = (undefined1)uVar3;
    auVar29[1] = (char)uVar4;
    auVar29._8_8_ = 0;
    auVar25._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(-cVar12,cVar12),-cVar11),
                                                       cVar11),-cVar10),cVar10),-cVar9),
                   CONCAT11(cVar9,cVar12)) >> 8);
    auVar25[7] = '@' - cVar8;
    auVar25[6] = cVar8;
    auVar25[5] = '@' - cVar7;
    auVar25[4] = cVar7;
    auVar25[3] = '@' - cVar6;
    auVar25[2] = cVar6;
    auVar25[1] = '@' - cVar5;
    auVar25[0] = cVar5;
    auVar17 = pmaddubsw(auVar29,auVar25);
    auVar17 = pmulhrsw(auVar17,auVar15);
    sVar16 = auVar17._0_2_;
    sVar18 = auVar17._2_2_;
    sVar19 = auVar17._4_2_;
    sVar20 = auVar17._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar17[6] - (0xff < sVar20),
                            CONCAT12((0 < sVar19) * (sVar19 < 0x100) * auVar17[4] - (0xff < sVar19),
                                     CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar17[2] -
                                              (0xff < sVar18),
                                              (0 < sVar16) * (sVar16 < 0x100) * auVar17[0] -
                                              (0xff < sVar16))));
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_sy_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  (void)w;

  do {
    const __m128i v_ra_b = xx_loadl_64(mask);
    const __m128i v_rb_b = xx_loadl_64(mask + mask_stride);
    const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
    const __m128i v_r_s_b = _mm_shuffle_epi8(v_rvs_b, v_shuffle_b);
    const __m128i v_r0_s_w = _mm_cvtepu8_epi16(v_r_s_b);
    const __m128i v_r1_s_w = _mm_cvtepu8_epi16(_mm_srli_si128(v_r_s_b, 8));
    const __m128i v_rs_w = _mm_add_epi16(v_r0_s_w, v_r1_s_w);
    const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
    const __m128i v_m0_b = _mm_packus_epi16(v_m0_w, v_m0_w);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}